

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int inittcpsrv(SOCKET *pSock,char *address,char *port,int maxnbcli,int timeout)

{
  int iVar1;
  undefined1 local_40 [8];
  sockaddr_in sa;
  int timeout_local;
  int maxnbcli_local;
  char *port_local;
  char *address_local;
  SOCKET *pSock_local;
  
  sa.sin_zero._0_4_ = timeout;
  sa.sin_zero._4_4_ = maxnbcli;
  iVar1 = socket(2,1,6);
  *pSock = iVar1;
  if (*pSock == -1) {
    pSock_local._4_4_ = 1;
  }
  else {
    iVar1 = setsockettimeouts(*pSock,sa.sin_zero._0_4_);
    if (iVar1 == 0) {
      iVar1 = setsocketreuseaddr(*pSock,1);
      if (iVar1 == 0) {
        memset(local_40,0,0x10);
        local_40._0_2_ = 2;
        iVar1 = atoi(port);
        local_40._2_2_ = htons((uint16_t)iVar1);
        local_40._4_4_ = inet_addr(address);
        iVar1 = bind(*pSock,(sockaddr *)local_40,0x10);
        if (iVar1 == 0) {
          iVar1 = listen(*pSock,sa.sin_zero._4_4_);
          if (iVar1 == 0) {
            pSock_local._4_4_ = 0;
          }
          else {
            close(*pSock);
            pSock_local._4_4_ = 1;
          }
        }
        else {
          close(*pSock);
          pSock_local._4_4_ = 1;
        }
      }
      else {
        close(*pSock);
        pSock_local._4_4_ = 1;
      }
    }
    else {
      close(*pSock);
      pSock_local._4_4_ = 1;
    }
  }
  return pSock_local._4_4_;
}

Assistant:

inline int inittcpsrv(SOCKET* pSock, char* address, char* port, int maxnbcli, int timeout)
{
	struct sockaddr_in sa;

#ifdef _WIN32
	WSADATA wsaData;
#endif // _WIN32

#ifdef _WIN32
	// Initiate use of the Winsock 2 DLL (WS2_32.dll) by a process.
	if (WSAStartup(MAKEWORD(2,2), &wsaData) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"WSAStartup failed. ", 
			address, port, maxnbcli, timeout));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	// Create a TCP IPv4 socket.
	*pSock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
	if (*pSock == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"socket failed. ", 
			address, port, maxnbcli, timeout));
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Configure timeouts for send and recv.
	if (setsockettimeouts(*pSock, timeout) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockettimeouts failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

#ifndef DISABLE_TCPSERVER_SO_REUSEADDR
	// Enable immediate reuse of the address and port.
	if (setsocketreuseaddr(*pSock, TRUE) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n",
			strtime_m(),
			"setsocketreuseaddr failed. ",
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}
#endif // DISABLE_TCPSERVER_SO_REUSEADDR

	memset(&sa, 0, sizeof(sa));

	// The sockaddr_in structure specifies the address family,
	// IP address, and port of the server.
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(port));
	sa.sin_addr.s_addr = inet_addr(address);

	// Associate the server to the desired address and port.
	if (bind(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"bind failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Set the number of simultaneous client connections that can be accepted by the server.
	if (listen(*pSock, maxnbcli) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpsrv error (%s) : %s(address=%s, port=%s, maxnbcli=%d, timeout=%d)\n", 
			strtime_m(), 
			"listen failed. ", 
			address, port, maxnbcli, timeout));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}